

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O2

string * __thiscall
rpn::FunctionRefExpression::GetFunctionResult_abi_cxx11_
          (string *__return_storage_ptr__,FunctionRefExpression *this,CommandContext *commandContext
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"[result_of(",&commandContext->result);
  std::operator+(__return_storage_ptr__,&local_30,")]");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFunctionResult(const CommandContext& commandContext) const
    {
        return {"[result_of(" + commandContext.result + ")]"};
    }